

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O1

void CVmObjList::remove_range
               (vm_val_t *retval,vm_val_t *self_val,char *lst,int start_idx,int del_cnt)

{
  CVmObjPageEntry *pCVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  vm_obj_id_t vVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  
  pvVar4 = sp_;
  uVar3 = *(undefined4 *)&self_val->field_0x4;
  aVar2 = self_val->val;
  sp_ = sp_ + 1;
  pvVar4->typ = self_val->typ;
  *(undefined4 *)&pvVar4->field_0x4 = uVar3;
  pvVar4->val = aVar2;
  uVar9 = (ulong)*(ushort *)lst;
  vVar5 = create(0,uVar9 - (long)del_cnt);
  retval->typ = VM_OBJ;
  (retval->val).obj = vVar5;
  pvVar4 = sp_;
  uVar3 = *(undefined4 *)&retval->field_0x4;
  aVar2 = retval->val;
  sp_ = sp_ + 1;
  pvVar4->typ = retval->typ;
  *(undefined4 *)&pvVar4->field_0x4 = uVar3;
  pvVar4->val = aVar2;
  uVar6 = (retval->val).obj & 0xfff;
  pCVar1 = G_obj_table_X.pages_[(retval->val).obj >> 0xc];
  pcVar7 = vm_val_t::get_as_list(self_val);
  if (start_idx != 0) {
    memcpy((void *)(*(long *)((long)&pCVar1->ptr_ + (ulong)(uVar6 * 0x18) + 8) + 2),pcVar7 + 2,
           (long)start_idx * 5);
  }
  uVar8 = (ulong)(del_cnt + start_idx);
  if (uVar8 <= uVar9 && uVar9 - uVar8 != 0) {
    memcpy((void *)(*(long *)((long)&pCVar1->ptr_ + (ulong)(uVar6 * 0x18) + 8) + (long)start_idx * 5
                   + 2),pcVar7 + uVar8 * 5 + 2,(uVar9 - uVar8) * 5);
  }
  sp_ = sp_ + -2;
  return;
}

Assistant:

void CVmObjList::remove_range(VMG_ vm_val_t *retval,
                              const vm_val_t *self_val,
                              const char *lst, int start_idx, int del_cnt)
{
    size_t lst_len;
    CVmObjList *new_lst;

    /* push myself onto the stack for GC protection */
    G_stk->push(self_val);

    /* get the original list length */
    lst_len = vmb_get_len(lst);
    
    /* 
     *   allocate a new list with space for the original list minus the
     *   elements to be deleted 
     */
    retval->set_obj(create(vmg_ FALSE, lst_len - del_cnt));

    /* push a reference to teh new list for gc protection */
    G_stk->push(retval);

    /* get the return value list data */
    new_lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* get the original list data as well */
    lst = self_val->get_as_list(vmg0_);

    /* 
     *   copy elements from the original list up to the first item to be
     *   removed 
     */
    if (start_idx != 0)
        new_lst->cons_copy_data(0, get_element_ptr_const(lst, 0), start_idx);

    /* 
     *   copy elements of the original list following the last item to be
     *   removed 
     */
    if ((size_t)(start_idx + del_cnt) < lst_len)
        new_lst->
            cons_copy_data(start_idx,
                           get_element_ptr_const(lst, start_idx + del_cnt),
                           lst_len - (start_idx + del_cnt));

    /* discard the gc protection */
    G_stk->discard(2);
}